

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O3

void __thiscall sf::Font::setSmooth(Font *this,bool smooth)

{
  _Rb_tree_node_base *p_Var1;
  
  if (this->m_isSmooth != smooth) {
    this->m_isSmooth = smooth;
    for (p_Var1 = (_Rb_tree_node_base *)
                  (this->m_pages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(this->m_pages)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      Texture::setSmooth((Texture *)&p_Var1[2]._M_right,this->m_isSmooth);
    }
  }
  return;
}

Assistant:

void Font::setSmooth(bool smooth)
{
    if (smooth != m_isSmooth)
    {
        m_isSmooth = smooth;

        for (sf::Font::PageTable::iterator page = m_pages.begin(); page != m_pages.end(); ++page)
        {
            page->second.texture.setSmooth(m_isSmooth);
        }
    }
}